

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLink.h
# Opt level: O2

void __thiscall chrono::ChLink::ChLink(ChLink *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  ChLinkBase::ChLinkBase(&this->super_ChLinkBase);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_01161a38;
  this->Body1 = (ChBodyFrame *)0x0;
  this->Body2 = (ChBodyFrame *)0x0;
  auVar1._8_8_ = DAT_011dd3e0;
  auVar1._0_8_ = VNULL;
  auVar3._8_8_ = DAT_011dd3e8;
  auVar3._0_8_ = DAT_011dd3e0;
  auVar2 = vunpcklpd_avx(auVar1,auVar3);
  auVar1 = vshufpd_avx(auVar3,auVar1,1);
  *(undefined1 (*) [16])((this->react_force).m_data + 2) = auVar1;
  *(undefined1 (*) [16])(this->react_force).m_data = auVar2;
  *(undefined1 (*) [16])((this->react_torque).m_data + 1) = auVar3;
  return;
}

Assistant:

virtual ~ChLink() {}